

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersectorKHybrid<8,_8,_1,_false,_embree::avx512::ArrayIntersectorK_1<8,_embree::avx512::ObjectIntersectorK<8,_false>_>,_false>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  ulong *puVar1;
  undefined4 uVar2;
  uint uVar3;
  ulong uVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  undefined8 uVar12;
  ulong uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  ulong uVar17;
  RTCIntersectFunctionN p_Var18;
  byte bVar19;
  ulong uVar20;
  long lVar21;
  byte bVar22;
  byte bVar23;
  ulong *puVar24;
  size_t i_1;
  undefined1 (*pauVar25) [32];
  byte bVar26;
  ulong uVar27;
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 in_ZMM1 [64];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [16];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 in_ZMM15 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  vint<8> mask;
  NodeRef stack_node [561];
  vfloat<8> stack_near [561];
  RTCIntersectFunctionNArguments local_5988;
  Geometry *local_5958;
  undefined8 local_5950;
  RTCIntersectArguments *local_5948;
  undefined1 local_5940 [32];
  undefined1 local_5920 [32];
  undefined1 local_5900 [32];
  undefined1 local_58e0 [32];
  undefined1 local_58c0 [32];
  undefined1 local_58a0 [32];
  undefined1 local_5880 [32];
  undefined1 local_5860 [32];
  undefined1 local_5840 [32];
  undefined8 local_5810;
  ulong local_5808 [561];
  undefined1 local_4680 [32];
  undefined1 local_4660 [32];
  undefined1 local_4640 [17936];
  
  local_5808[0] = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_5808[0] != 8) {
    if ((context->user == (RTCRayQueryContext *)0x0) ||
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) == RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      auVar28 = vpcmpeqd_avx2(in_ZMM1._0_32_,in_ZMM1._0_32_);
      auVar44 = ZEXT816(0) << 0x40;
      uVar27 = vcmpps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar44),5);
      uVar20 = vpcmpeqd_avx512vl(auVar28,(undefined1  [32])valid_i->field_0);
      uVar27 = uVar27 & uVar20;
      bVar26 = (byte)uVar27;
      if (bVar26 != 0) {
        auVar28 = *(undefined1 (*) [32])(ray + 0x80);
        auVar32 = *(undefined1 (*) [32])(ray + 0xa0);
        auVar29 = *(undefined1 (*) [32])(ray + 0xc0);
        auVar34._8_4_ = 0x7fffffff;
        auVar34._0_8_ = 0x7fffffff7fffffff;
        auVar34._12_4_ = 0x7fffffff;
        auVar34._16_4_ = 0x7fffffff;
        auVar34._20_4_ = 0x7fffffff;
        auVar34._24_4_ = 0x7fffffff;
        auVar34._28_4_ = 0x7fffffff;
        auVar30 = vandps_avx(auVar28,auVar34);
        auVar38._8_4_ = 0x219392ef;
        auVar38._0_8_ = 0x219392ef219392ef;
        auVar38._12_4_ = 0x219392ef;
        auVar38._16_4_ = 0x219392ef;
        auVar38._20_4_ = 0x219392ef;
        auVar38._24_4_ = 0x219392ef;
        auVar38._28_4_ = 0x219392ef;
        uVar20 = vcmpps_avx512vl(auVar30,auVar38,1);
        bVar5 = (bool)((byte)uVar20 & 1);
        auVar30._0_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar28._0_4_;
        bVar5 = (bool)((byte)(uVar20 >> 1) & 1);
        auVar30._4_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar28._4_4_;
        bVar5 = (bool)((byte)(uVar20 >> 2) & 1);
        auVar30._8_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar28._8_4_;
        bVar5 = (bool)((byte)(uVar20 >> 3) & 1);
        auVar30._12_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar28._12_4_;
        bVar5 = (bool)((byte)(uVar20 >> 4) & 1);
        auVar30._16_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar28._16_4_;
        bVar5 = (bool)((byte)(uVar20 >> 5) & 1);
        auVar30._20_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar28._20_4_;
        bVar5 = (bool)((byte)(uVar20 >> 6) & 1);
        auVar30._24_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar28._24_4_;
        bVar5 = SUB81(uVar20 >> 7,0);
        auVar30._28_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar28._28_4_;
        auVar28 = vandps_avx(auVar32,auVar34);
        uVar20 = vcmpps_avx512vl(auVar28,auVar38,1);
        bVar5 = (bool)((byte)uVar20 & 1);
        auVar31._0_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar32._0_4_;
        bVar5 = (bool)((byte)(uVar20 >> 1) & 1);
        auVar31._4_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar32._4_4_;
        bVar5 = (bool)((byte)(uVar20 >> 2) & 1);
        auVar31._8_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar32._8_4_;
        bVar5 = (bool)((byte)(uVar20 >> 3) & 1);
        auVar31._12_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar32._12_4_;
        bVar5 = (bool)((byte)(uVar20 >> 4) & 1);
        auVar31._16_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar32._16_4_;
        bVar5 = (bool)((byte)(uVar20 >> 5) & 1);
        auVar31._20_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar32._20_4_;
        bVar5 = (bool)((byte)(uVar20 >> 6) & 1);
        auVar31._24_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar32._24_4_;
        bVar5 = SUB81(uVar20 >> 7,0);
        auVar31._28_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar32._28_4_;
        auVar28 = vandps_avx(auVar29,auVar34);
        uVar20 = vcmpps_avx512vl(auVar28,auVar38,1);
        bVar5 = (bool)((byte)uVar20 & 1);
        auVar28._0_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar29._0_4_;
        bVar5 = (bool)((byte)(uVar20 >> 1) & 1);
        auVar28._4_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar29._4_4_;
        bVar5 = (bool)((byte)(uVar20 >> 2) & 1);
        auVar28._8_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar29._8_4_;
        bVar5 = (bool)((byte)(uVar20 >> 3) & 1);
        auVar28._12_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar29._12_4_;
        bVar5 = (bool)((byte)(uVar20 >> 4) & 1);
        auVar28._16_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar29._16_4_;
        bVar5 = (bool)((byte)(uVar20 >> 5) & 1);
        auVar28._20_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar29._20_4_;
        bVar5 = (bool)((byte)(uVar20 >> 6) & 1);
        auVar28._24_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar29._24_4_;
        bVar5 = SUB81(uVar20 >> 7,0);
        auVar28._28_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar29._28_4_;
        auVar29 = vrcp14ps_avx512vl(auVar30);
        auVar32._8_4_ = 0x3f800000;
        auVar32._0_8_ = 0x3f8000003f800000;
        auVar32._12_4_ = 0x3f800000;
        auVar32._16_4_ = 0x3f800000;
        auVar32._20_4_ = 0x3f800000;
        auVar32._24_4_ = 0x3f800000;
        auVar32._28_4_ = 0x3f800000;
        auVar14 = vfnmadd213ps_fma(auVar30,auVar29,auVar32);
        auVar30 = vrcp14ps_avx512vl(auVar31);
        auVar15 = vfnmadd213ps_fma(auVar31,auVar30,auVar32);
        auVar31 = vrcp14ps_avx512vl(auVar28);
        auVar16 = vfnmadd213ps_fma(auVar28,auVar31,auVar32);
        local_4680._8_4_ = 0x7f800000;
        local_4680._0_8_ = 0x7f8000007f800000;
        local_4680._12_4_ = 0x7f800000;
        local_4680._16_4_ = 0x7f800000;
        local_4680._20_4_ = 0x7f800000;
        local_4680._24_4_ = 0x7f800000;
        local_4680._28_4_ = 0x7f800000;
        auVar48 = ZEXT3264(local_4680);
        auVar28 = *(undefined1 (*) [32])ray;
        auVar32 = *(undefined1 (*) [32])(ray + 0x20);
        auVar42._0_8_ = auVar32._0_8_ ^ 0x8000000080000000;
        auVar42._8_4_ = auVar32._8_4_ ^ 0x80000000;
        auVar42._12_4_ = auVar32._12_4_ ^ 0x80000000;
        auVar42._16_4_ = auVar32._16_4_ ^ 0x80000000;
        auVar42._20_4_ = auVar32._20_4_ ^ 0x80000000;
        auVar42._24_4_ = auVar32._24_4_ ^ 0x80000000;
        auVar42._28_4_ = auVar32._28_4_ ^ 0x80000000;
        auVar32 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x60),ZEXT1632(auVar44));
        local_58e0._0_4_ =
             (uint)(bVar26 & 1) * auVar32._0_4_ | (uint)!(bool)(bVar26 & 1) * 0x7f800000;
        bVar5 = (bool)((byte)(uVar27 >> 1) & 1);
        local_58e0._4_4_ = (uint)bVar5 * auVar32._4_4_ | (uint)!bVar5 * 0x7f800000;
        bVar5 = (bool)((byte)(uVar27 >> 2) & 1);
        local_58e0._8_4_ = (uint)bVar5 * auVar32._8_4_ | (uint)!bVar5 * 0x7f800000;
        bVar5 = (bool)((byte)(uVar27 >> 3) & 1);
        local_58e0._12_4_ = (uint)bVar5 * auVar32._12_4_ | (uint)!bVar5 * 0x7f800000;
        bVar5 = (bool)((byte)(uVar27 >> 4) & 1);
        local_58e0._16_4_ = (uint)bVar5 * auVar32._16_4_ | (uint)!bVar5 * 0x7f800000;
        bVar5 = (bool)((byte)(uVar27 >> 5) & 1);
        local_58e0._20_4_ = (uint)bVar5 * auVar32._20_4_ | (uint)!bVar5 * 0x7f800000;
        bVar5 = (bool)((byte)(uVar27 >> 6) & 1);
        local_58e0._24_4_ = (uint)bVar5 * auVar32._24_4_ | (uint)!bVar5 * 0x7f800000;
        bVar5 = SUB81(uVar27 >> 7,0);
        local_58e0._28_4_ = (uint)bVar5 * auVar32._28_4_ | (uint)!bVar5 * 0x7f800000;
        auVar49 = ZEXT3264(local_58e0);
        auVar32 = *(undefined1 (*) [32])(ray + 0x40);
        auVar33._0_8_ = auVar32._0_8_ ^ 0x8000000080000000;
        auVar33._8_4_ = auVar32._8_4_ ^ 0x80000000;
        auVar33._12_4_ = auVar32._12_4_ ^ 0x80000000;
        auVar33._16_4_ = auVar32._16_4_ ^ 0x80000000;
        auVar33._20_4_ = auVar32._20_4_ ^ 0x80000000;
        auVar33._24_4_ = auVar32._24_4_ ^ 0x80000000;
        auVar33._28_4_ = auVar32._28_4_ ^ 0x80000000;
        auVar15 = vfmadd132ps_fma(ZEXT1632(auVar15),auVar30,auVar30);
        auVar46 = ZEXT1664(auVar15);
        auVar32 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar44));
        bVar5 = (bool)((byte)(uVar27 >> 1) & 1);
        bVar6 = (bool)((byte)(uVar27 >> 2) & 1);
        bVar7 = (bool)((byte)(uVar27 >> 3) & 1);
        bVar8 = (bool)((byte)(uVar27 >> 4) & 1);
        bVar9 = (bool)((byte)(uVar27 >> 5) & 1);
        bVar10 = (bool)((byte)(uVar27 >> 6) & 1);
        bVar11 = SUB81(uVar27 >> 7,0);
        auVar50 = ZEXT3264(CONCAT428((uint)bVar11 * auVar32._28_4_ | (uint)!bVar11 * -0x800000,
                                     CONCAT424((uint)bVar10 * auVar32._24_4_ |
                                               (uint)!bVar10 * -0x800000,
                                               CONCAT420((uint)bVar9 * auVar32._20_4_ |
                                                         (uint)!bVar9 * -0x800000,
                                                         CONCAT416((uint)bVar8 * auVar32._16_4_ |
                                                                   (uint)!bVar8 * -0x800000,
                                                                   CONCAT412((uint)bVar7 *
                                                                             auVar32._12_4_ |
                                                                             (uint)!bVar7 *
                                                                             -0x800000,
                                                                             CONCAT48((uint)bVar6 *
                                                                                      auVar32._8_4_
                                                                                      | (uint)!bVar6
                                                                                        * -0x800000,
                                                                                      CONCAT44((uint
                                                  )bVar5 * auVar32._4_4_ | (uint)!bVar5 * -0x800000,
                                                  (uint)(bVar26 & 1) * auVar32._0_4_ |
                                                  (uint)!(bool)(bVar26 & 1) * -0x800000))))))));
        auVar44 = vfmadd132ps_fma(ZEXT1632(auVar14),auVar29,auVar29);
        auVar45 = ZEXT1664(auVar44);
        auVar14 = vfmadd132ps_fma(ZEXT1632(auVar16),auVar31,auVar31);
        auVar47 = ZEXT1664(auVar14);
        bVar23 = ~bVar26;
        puVar24 = local_5808 + 1;
        local_5810 = 0xfffffffffffffff8;
        pauVar25 = (undefined1 (*) [32])local_4640;
        local_4660 = local_58e0;
        auVar51._0_4_ = auVar44._0_4_ * -auVar28._0_4_;
        auVar51._4_4_ = auVar44._4_4_ * -auVar28._4_4_;
        auVar51._8_4_ = auVar44._8_4_ * -auVar28._8_4_;
        auVar51._12_4_ = auVar44._12_4_ * -auVar28._12_4_;
        auVar51._16_4_ = -auVar28._16_4_ * 0.0;
        auVar51._20_4_ = -auVar28._20_4_ * 0.0;
        auVar51._28_36_ = in_ZMM15._28_36_;
        auVar51._24_4_ = -auVar28._24_4_ * 0.0;
        local_5900 = auVar51._0_32_;
        auVar51 = ZEXT3264(local_5900);
        local_58a0 = ZEXT1632(auVar15);
        local_5920 = vmulps_avx512vl(local_58a0,auVar42);
        auVar52 = ZEXT3264(local_5920);
        local_58c0 = ZEXT1632(auVar14);
        local_5940 = vmulps_avx512vl(local_58c0,auVar33);
        auVar53 = ZEXT3264(local_5940);
        local_5880 = ZEXT1632(auVar44);
LAB_01de8d69:
        puVar1 = puVar24 + -1;
        if (*puVar1 != 0xfffffffffffffff8) {
          puVar24 = puVar24 + -1;
          auVar28 = pauVar25[-1];
          pauVar25 = pauVar25 + -1;
          local_5860 = auVar50._0_32_;
          uVar12 = vcmpps_avx512vl(auVar28,local_5860,1);
          uVar27 = *puVar1;
          if ((char)uVar12 != '\0') {
            do {
              if ((uVar27 & 8) != 0) {
                if (uVar27 == 0xfffffffffffffff8) goto LAB_01de904d;
                uVar12 = vcmpps_avx512vl(local_5860,auVar28,6);
                if ((char)uVar12 != '\0') {
                  bVar19 = ~bVar23;
                  lVar21 = 0;
                  goto LAB_01de8eef;
                }
                break;
              }
              uVar20 = 8;
              auVar28 = auVar48._0_32_;
              for (lVar21 = 0;
                  (lVar21 != 8 &&
                  (uVar4 = *(ulong *)((uVar27 & 0xfffffffffffffff0) + lVar21 * 8), uVar4 != 8));
                  lVar21 = lVar21 + 1) {
                uVar2 = *(undefined4 *)(uVar27 + 0x40 + lVar21 * 4);
                auVar36._4_4_ = uVar2;
                auVar36._0_4_ = uVar2;
                auVar36._8_4_ = uVar2;
                auVar36._12_4_ = uVar2;
                auVar36._16_4_ = uVar2;
                auVar36._20_4_ = uVar2;
                auVar36._24_4_ = uVar2;
                auVar36._28_4_ = uVar2;
                auVar44 = vfmadd132ps_fma(auVar36,auVar51._0_32_,auVar45._0_32_);
                uVar2 = *(undefined4 *)(uVar27 + 0x80 + lVar21 * 4);
                auVar37._4_4_ = uVar2;
                auVar37._0_4_ = uVar2;
                auVar37._8_4_ = uVar2;
                auVar37._12_4_ = uVar2;
                auVar37._16_4_ = uVar2;
                auVar37._20_4_ = uVar2;
                auVar37._24_4_ = uVar2;
                auVar37._28_4_ = uVar2;
                auVar30 = vfmadd132ps_avx512vl(auVar37,auVar52._0_32_,auVar46._0_32_);
                uVar2 = *(undefined4 *)(uVar27 + 0xc0 + lVar21 * 4);
                auVar39._4_4_ = uVar2;
                auVar39._0_4_ = uVar2;
                auVar39._8_4_ = uVar2;
                auVar39._12_4_ = uVar2;
                auVar39._16_4_ = uVar2;
                auVar39._20_4_ = uVar2;
                auVar39._24_4_ = uVar2;
                auVar39._28_4_ = uVar2;
                auVar33 = vfmadd132ps_avx512vl(auVar39,auVar53._0_32_,auVar47._0_32_);
                uVar2 = *(undefined4 *)(uVar27 + 0x60 + lVar21 * 4);
                auVar40._4_4_ = uVar2;
                auVar40._0_4_ = uVar2;
                auVar40._8_4_ = uVar2;
                auVar40._12_4_ = uVar2;
                auVar40._16_4_ = uVar2;
                auVar40._20_4_ = uVar2;
                auVar40._24_4_ = uVar2;
                auVar40._28_4_ = uVar2;
                auVar15 = vfmadd132ps_fma(auVar40,auVar51._0_32_,auVar45._0_32_);
                uVar2 = *(undefined4 *)(uVar27 + 0xa0 + lVar21 * 4);
                auVar41._4_4_ = uVar2;
                auVar41._0_4_ = uVar2;
                auVar41._8_4_ = uVar2;
                auVar41._12_4_ = uVar2;
                auVar41._16_4_ = uVar2;
                auVar41._20_4_ = uVar2;
                auVar41._24_4_ = uVar2;
                auVar41._28_4_ = uVar2;
                auVar31 = vfmadd132ps_avx512vl(auVar41,auVar52._0_32_,auVar46._0_32_);
                uVar2 = *(undefined4 *)(uVar27 + 0xe0 + lVar21 * 4);
                auVar43._4_4_ = uVar2;
                auVar43._0_4_ = uVar2;
                auVar43._8_4_ = uVar2;
                auVar43._12_4_ = uVar2;
                auVar43._16_4_ = uVar2;
                auVar43._20_4_ = uVar2;
                auVar43._24_4_ = uVar2;
                auVar43._28_4_ = uVar2;
                auVar34 = vfmadd132ps_avx512vl(auVar43,auVar53._0_32_,auVar47._0_32_);
                auVar32 = vpminsd_avx2(ZEXT1632(auVar44),ZEXT1632(auVar15));
                auVar29 = vpminsd_avx2(auVar30,auVar31);
                auVar32 = vpmaxsd_avx2(auVar32,auVar29);
                auVar29 = vpminsd_avx2(auVar33,auVar34);
                auVar32 = vpmaxsd_avx2(auVar32,auVar29);
                auVar29 = vpmaxsd_avx2(ZEXT1632(auVar44),ZEXT1632(auVar15));
                auVar30 = vpmaxsd_avx2(auVar30,auVar31);
                auVar31 = vpminsd_avx2(auVar29,auVar30);
                auVar29 = vpmaxsd_avx2(auVar33,auVar34);
                auVar30 = vpmaxsd_avx2(auVar32,auVar49._0_32_);
                auVar29 = vpminsd_avx2(auVar29,local_5860);
                auVar29 = vpminsd_avx2(auVar31,auVar29);
                uVar13 = vpcmpd_avx512vl(auVar30,auVar29,2);
                uVar17 = uVar20;
                auVar35 = auVar28;
                if ((byte)uVar13 != 0) {
                  auVar29 = vblendmps_avx512vl(auVar48._0_32_,auVar32);
                  bVar5 = (bool)((byte)uVar13 & 1);
                  auVar35._0_4_ = (uint)bVar5 * auVar29._0_4_ | (uint)!bVar5 * auVar32._0_4_;
                  bVar5 = (bool)((byte)(uVar13 >> 1) & 1);
                  auVar35._4_4_ = (uint)bVar5 * auVar29._4_4_ | (uint)!bVar5 * auVar32._4_4_;
                  bVar5 = (bool)((byte)(uVar13 >> 2) & 1);
                  auVar35._8_4_ = (uint)bVar5 * auVar29._8_4_ | (uint)!bVar5 * auVar32._8_4_;
                  bVar5 = (bool)((byte)(uVar13 >> 3) & 1);
                  auVar35._12_4_ = (uint)bVar5 * auVar29._12_4_ | (uint)!bVar5 * auVar32._12_4_;
                  bVar5 = (bool)((byte)(uVar13 >> 4) & 1);
                  auVar35._16_4_ = (uint)bVar5 * auVar29._16_4_ | (uint)!bVar5 * auVar32._16_4_;
                  bVar5 = (bool)((byte)(uVar13 >> 5) & 1);
                  auVar35._20_4_ = (uint)bVar5 * auVar29._20_4_ | (uint)!bVar5 * auVar32._20_4_;
                  bVar5 = (bool)((byte)(uVar13 >> 6) & 1);
                  auVar35._24_4_ = (uint)bVar5 * auVar29._24_4_ | (uint)!bVar5 * auVar32._24_4_;
                  bVar5 = SUB81(uVar13 >> 7,0);
                  auVar35._28_4_ = (uint)bVar5 * auVar29._28_4_ | (uint)!bVar5 * auVar32._28_4_;
                  uVar17 = uVar4;
                  if (uVar20 != 8) {
                    *puVar24 = uVar20;
                    puVar24 = puVar24 + 1;
                    *pauVar25 = auVar28;
                    pauVar25 = pauVar25 + 1;
                  }
                }
                auVar28 = auVar35;
                uVar20 = uVar17;
              }
              uVar27 = uVar20;
            } while (uVar20 != 8);
          }
          goto LAB_01de8d69;
        }
LAB_01de904d:
        bVar23 = bVar23 & bVar26;
        bVar5 = (bool)(bVar23 >> 1 & 1);
        bVar6 = (bool)(bVar23 >> 2 & 1);
        bVar7 = (bool)(bVar23 >> 3 & 1);
        bVar8 = (bool)(bVar23 >> 4 & 1);
        bVar9 = (bool)(bVar23 >> 5 & 1);
        bVar10 = (bool)(bVar23 >> 6 & 1);
        *(uint *)(ray + 0x100) =
             (uint)(bVar23 & 1) * -0x800000 | (uint)!(bool)(bVar23 & 1) * *(int *)(ray + 0x100);
        *(uint *)(ray + 0x104) = (uint)bVar5 * -0x800000 | (uint)!bVar5 * *(int *)(ray + 0x104);
        *(uint *)(ray + 0x108) = (uint)bVar6 * -0x800000 | (uint)!bVar6 * *(int *)(ray + 0x108);
        *(uint *)(ray + 0x10c) = (uint)bVar7 * -0x800000 | (uint)!bVar7 * *(int *)(ray + 0x10c);
        *(uint *)(ray + 0x110) = (uint)bVar8 * -0x800000 | (uint)!bVar8 * *(int *)(ray + 0x110);
        *(uint *)(ray + 0x114) = (uint)bVar9 * -0x800000 | (uint)!bVar9 * *(int *)(ray + 0x114);
        *(uint *)(ray + 0x118) = (uint)bVar10 * -0x800000 | (uint)!bVar10 * *(int *)(ray + 0x118);
        *(uint *)(ray + 0x11c) =
             (uint)(bVar23 >> 7) * -0x800000 | (uint)!(bool)(bVar23 >> 7) * *(int *)(ray + 0x11c);
      }
    }
    else {
      occludedCoherent(valid_i,This,ray,context);
    }
  }
  return;
  while( true ) {
    local_5988.geomID = *(uint *)((uVar27 & 0xfffffffffffffff0) + lVar21 * 8);
    local_5958 = (context->scene->geometries).items[local_5988.geomID].ptr;
    uVar3 = local_5958->mask;
    auVar29._4_4_ = uVar3;
    auVar29._0_4_ = uVar3;
    auVar29._8_4_ = uVar3;
    auVar29._12_4_ = uVar3;
    auVar29._16_4_ = uVar3;
    auVar29._20_4_ = uVar3;
    auVar29._24_4_ = uVar3;
    auVar29._28_4_ = uVar3;
    uVar12 = vptestmd_avx512vl(auVar29,*(undefined1 (*) [32])(ray + 0x120));
    bVar22 = (byte)uVar12 & bVar19;
    if (bVar22 == 0) {
      bVar22 = 0xff;
    }
    else {
      local_5988.primID = *(uint *)((uVar27 & 0xfffffffffffffff0) + 4 + lVar21 * 8);
      local_5840 = vpmovm2d_avx512vl((ulong)bVar22);
      local_5988.valid = (int *)local_5840;
      local_5988.geometryUserPtr = local_5958->userPtr;
      local_5988.context = context->user;
      local_5988.N = 8;
      local_5950 = 0;
      local_5948 = context->args;
      p_Var18 = local_5948->intersect;
      if (p_Var18 == (RTCIntersectFunctionN)0x0) {
        p_Var18 = (RTCIntersectFunctionN)
                  local_5958[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      }
      local_5988.rayhit = (RTCRayHitN *)ray;
      (*p_Var18)(&local_5988);
      uVar12 = vcmpps_avx512vl(SUB6432(ZEXT1664((undefined1  [16])0x0),0),
                               *(undefined1 (*) [32])(ray + 0x100),0xe);
      bVar22 = ~(byte)uVar12;
      auVar45 = ZEXT3264(local_5880);
      auVar46 = ZEXT3264(local_58a0);
      auVar47 = ZEXT3264(local_58c0);
      auVar48 = ZEXT3264(CONCAT428(0x7f800000,
                                   CONCAT424(0x7f800000,
                                             CONCAT420(0x7f800000,
                                                       CONCAT416(0x7f800000,
                                                                 CONCAT412(0x7f800000,
                                                                           CONCAT48(0x7f800000,
                                                                                                                                                                        
                                                  0x7f8000007f800000)))))));
      auVar49 = ZEXT3264(local_58e0);
      auVar50 = ZEXT3264(local_5860);
      auVar51 = ZEXT3264(local_5900);
      auVar52 = ZEXT3264(local_5920);
      auVar53 = ZEXT3264(local_5940);
    }
    auVar28 = auVar50._0_32_;
    lVar21 = lVar21 + 1;
    bVar19 = bVar19 & bVar22;
    if (bVar19 == 0) break;
LAB_01de8eef:
    auVar28 = auVar50._0_32_;
    if ((ulong)((uint)uVar27 & 0xf) - 8 == lVar21) goto LAB_01de9025;
  }
  bVar19 = 0;
LAB_01de9025:
  bVar23 = bVar23 | ~bVar19;
  if (bVar23 == 0xff) {
    bVar23 = 0xff;
    goto LAB_01de904d;
  }
  auVar32 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
  bVar5 = (bool)(bVar23 >> 1 & 1);
  bVar6 = (bool)(bVar23 >> 2 & 1);
  bVar7 = (bool)(bVar23 >> 3 & 1);
  bVar8 = (bool)(bVar23 >> 4 & 1);
  bVar9 = (bool)(bVar23 >> 5 & 1);
  bVar10 = (bool)(bVar23 >> 6 & 1);
  auVar50 = ZEXT3264(CONCAT428((uint)(bVar23 >> 7) * auVar32._28_4_ |
                               (uint)!(bool)(bVar23 >> 7) * auVar28._28_4_,
                               CONCAT424((uint)bVar10 * auVar32._24_4_ |
                                         (uint)!bVar10 * auVar28._24_4_,
                                         CONCAT420((uint)bVar9 * auVar32._20_4_ |
                                                   (uint)!bVar9 * auVar28._20_4_,
                                                   CONCAT416((uint)bVar8 * auVar32._16_4_ |
                                                             (uint)!bVar8 * auVar28._16_4_,
                                                             CONCAT412((uint)bVar7 * auVar32._12_4_
                                                                       | (uint)!bVar7 *
                                                                         auVar28._12_4_,
                                                                       CONCAT48((uint)bVar6 *
                                                                                auVar32._8_4_ |
                                                                                (uint)!bVar6 *
                                                                                auVar28._8_4_,
                                                                                CONCAT44((uint)bVar5
                                                                                         * auVar32.
                                                  _4_4_ | (uint)!bVar5 * auVar28._4_4_,
                                                  (uint)(bVar23 & 1) * auVar32._0_4_ |
                                                  (uint)!(bool)(bVar23 & 1) * auVar28._0_4_))))))));
  goto LAB_01de8d69;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }